

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op,BaseType input_type,bool skip_cast_if_equal_type,bool implicit_integer_promotion)

{
  __node_base_ptr *this_00;
  bool bVar1;
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar2;
  SPIRType *pSVar3;
  bool local_2e5;
  char local_2a2 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0 [32];
  spirv_cross local_280 [38];
  char local_25a [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [32];
  spirv_cross local_238 [32];
  string local_218 [8];
  string expr;
  spirv_cross local_1f8 [8];
  string bitop;
  SPIRType *out_type;
  undefined1 local_1c0 [8];
  SPIRType expected_type;
  string cast_op1;
  string local_50 [8];
  string cast_op0;
  bool implicit_integer_promotion_local;
  char *pcStack_28;
  bool skip_cast_if_equal_type_local;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  bVar1 = implicit_integer_promotion;
  bVar2 = skip_cast_if_equal_type;
  pcStack_28 = op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  ::std::__cxx11::string::string(local_50);
  this_00 = &expected_type.member_name_cache._M_h._M_single_bucket;
  ::std::__cxx11::string::string((string *)this_00);
  binary_op_bitcast_helper
            ((SPIRType *)local_1c0,this,(string *)local_50,(string *)this_00,&input_type,
             op_local._4_4_,(uint32_t)op_local,bVar2);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,op0_local);
  join<std::__cxx11::string&,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string&>
            (local_1f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
             ,(char (*) [2])0x5b521c,&stack0xffffffffffffffd8,(char (*) [2])0x5b521c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expected_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::string(local_218);
  if (bVar1) {
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_258,this,pSVar3,0);
    local_25a[1] = 0x28;
    local_25a[0] = ')';
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (local_238,local_258,local_25a + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
               local_25a);
    ::std::__cxx11::string::operator=(local_218,(string *)local_238);
    ::std::__cxx11::string::~string((string *)local_238);
    ::std::__cxx11::string::~string((string *)local_258);
  }
  else if ((*(BaseType *)&(pSVar3->super_IVariant).field_0xc == input_type) ||
          (*(int *)&(pSVar3->super_IVariant).field_0xc == 2)) {
    ::std::__cxx11::string::operator=(local_218,(string *)local_1f8);
  }
  else {
    expected_type.super_IVariant._vptr_IVariant._4_4_ = input_type;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_2a0,this,pSVar3,local_1c0);
    local_2a2[1] = 0x28;
    local_2a2[0] = ')';
    join<std::__cxx11::string,char,std::__cxx11::string&,char>
              (local_280,local_2a0,local_2a2 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
               local_2a2);
    ::std::__cxx11::string::operator=(local_218,(string *)local_280);
    ::std::__cxx11::string::~string((string *)local_280);
    ::std::__cxx11::string::~string((string *)local_2a0);
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  bVar2 = should_forward(this,op_local._4_4_);
  local_2e5 = false;
  if (bVar2) {
    local_2e5 = should_forward(this,(uint32_t)op_local);
  }
  emit_op(this,result_type_00,result_id_00,(string *)local_218,local_2e5,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,(uint32_t)op_local);
  ::std::__cxx11::string::~string(local_218);
  ::std::__cxx11::string::~string((string *)local_1f8);
  SPIRType::~SPIRType((SPIRType *)local_1c0);
  ::std::__cxx11::string::~string((string *)&expected_type.member_name_cache._M_h._M_single_bucket);
  ::std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op, SPIRType::BaseType input_type,
                                       bool skip_cast_if_equal_type,
                                       bool implicit_integer_promotion)
{
	string cast_op0, cast_op1;
	auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, op0, op1, skip_cast_if_equal_type);
	auto &out_type = get<SPIRType>(result_type);

	// We might have casted away from the result type, so bitcast again.
	// For example, arithmetic right shift with uint inputs.
	// Special case boolean outputs since relational opcodes output booleans instead of int/uint.
	auto bitop = join(cast_op0, " ", op, " ", cast_op1);
	string expr;

	if (implicit_integer_promotion)
	{
		// Simple value cast.
		expr = join(type_to_glsl(out_type), '(', bitop, ')');
	}
	else if (out_type.basetype != input_type && out_type.basetype != SPIRType::Boolean)
	{
		expected_type.basetype = input_type;
		expr = join(bitcast_glsl_op(out_type, expected_type), '(', bitop, ')');
	}
	else
	{
		expr = std::move(bitop);
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}